

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool __thiscall QXmlStreamReaderPrivate::scanPublicOrSystem(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  uint uVar2;
  char **ppcVar3;
  short tokenToInject;
  
  uVar2 = peekChar(this);
  if (uVar2 == 0x53) {
    ppcVar3 = QXmlStreamGrammar::spell + 0x22;
    tokenToInject = 0x22;
  }
  else {
    if (uVar2 != 0x50) {
      return false;
    }
    ppcVar3 = QXmlStreamGrammar::spell + 0x23;
    tokenToInject = 0x23;
  }
  bVar1 = scanString(this,*ppcVar3,tokenToInject,true);
  return bVar1;
}

Assistant:

bool QXmlStreamReaderPrivate::scanPublicOrSystem()
{
    switch (peekChar()) {
    case 'S':
        return scanString(spell[SYSTEM], SYSTEM);
    case 'P':
        return scanString(spell[PUBLIC], PUBLIC);
    default:
        ;
    }
    return false;
}